

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Drop * __thiscall wasm::Builder::makeDrop(Builder *this,Expression *value)

{
  Drop *pDVar1;
  Drop *ret;
  Expression *value_local;
  Builder *this_local;
  
  pDVar1 = MixedArena::alloc<wasm::Drop>((MixedArena *)(this->wasm + 0x158));
  pDVar1->value = value;
  wasm::Drop::finalize();
  return pDVar1;
}

Assistant:

Drop* makeDrop(Expression* value) {
    auto* ret = wasm.allocator.alloc<Drop>();
    ret->value = value;
    ret->finalize();
    return ret;
  }